

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

uint __thiscall CScript::GetSigOpCount(CScript *this,bool fAccurate)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  opcodetype oVar4;
  CScript *pCVar5;
  const_iterator end;
  uint uVar6;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  opcodetype local_44;
  const_iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.ptr = (uchar *)this;
  if (0x1c < (this->super_CScriptBase)._size) {
    local_40.ptr = (uchar *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  }
  uVar6 = 0;
  oVar4 = OP_INVALIDOPCODE;
  do {
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar5 = this;
    }
    end.ptr = (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar2);
    if (end.ptr <= local_40.ptr) break;
    bVar3 = GetScriptOp(&local_40,end,&local_44,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
    if (bVar3) {
      if ((local_44 & 0xfffffffe) == OP_CHECKMULTISIG) {
        if ((fAccurate) && (oVar4 - OP_1 < 0x10)) {
          uVar6 = (uVar6 + oVar4) - 0x50;
          oVar4 = local_44;
        }
        else {
          uVar6 = uVar6 + 0x14;
          oVar4 = local_44;
        }
      }
      else {
        oVar4 = local_44;
        if ((local_44 & 0xfffffffe) == OP_CHECKSIG) {
          uVar6 = uVar6 + 1;
        }
      }
    }
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

unsigned int CScript::GetSigOpCount(bool fAccurate) const
{
    unsigned int n = 0;
    const_iterator pc = begin();
    opcodetype lastOpcode = OP_INVALIDOPCODE;
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            break;
        if (opcode == OP_CHECKSIG || opcode == OP_CHECKSIGVERIFY)
            n++;
        else if (opcode == OP_CHECKMULTISIG || opcode == OP_CHECKMULTISIGVERIFY)
        {
            if (fAccurate && lastOpcode >= OP_1 && lastOpcode <= OP_16)
                n += DecodeOP_N(lastOpcode);
            else
                n += MAX_PUBKEYS_PER_MULTISIG;
        }
        lastOpcode = opcode;
    }
    return n;
}